

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionState.h
# Opt level: O2

bool __thiscall FIX::SessionState::needTestRequest(SessionState *this)

{
  int iVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  UtcTimeStamp now;
  UtcTimeStamp local_28;
  
  UtcTimeStamp::UtcTimeStamp(&local_28);
  iVar1 = (this->m_lastReceivedTime).super_DateTime.m_date;
  lVar3 = (this->m_lastReceivedTime).super_DateTime.m_time;
  iVar2 = this->m_testRequest;
  iVar4 = IntField::getValue(&(this->m_heartBtInt).super_IntField);
  return (double)iVar4 * ((double)iVar2 + 1.0) * 1.2 <=
         (double)((int)(lVar3 / -1000000000) +
                 (int)(local_28.super_DateTime.m_time / 1000000000) +
                 (local_28.super_DateTime.m_date - iVar1) * 0x15180);
}

Assistant:

bool needTestRequest() const
  {
    UtcTimeStamp now;
    return ( now - lastReceivedTime() ) >=
           ( ( 1.2 * ( ( double ) testRequest() + 1 ) ) * ( double ) heartBtInt() );
  }